

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O0

int __thiscall RecordPaddingField::StaticSize(RecordPaddingField *this,Env *env,int offset)

{
  DDE_Type DVar1;
  bool bVar2;
  undefined8 uVar3;
  uint in_EDX;
  Expr *in_RDI;
  string *unaff_retaddr;
  Object *in_stack_00000008;
  ExceptionPaddingError *in_stack_00000010;
  int offset_in_word;
  int target_offset;
  int length;
  int local_84;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char local_48 [36];
  uint local_24;
  int local_20;
  uint local_1c;
  int local_4;
  
  DVar1 = in_RDI[1].super_DataDepElement.dde_type_;
  if (DVar1 == ATTR) {
    bVar2 = Expr::ConstFold(in_RDI,(Env *)CONCAT44(in_stack_ffffffffffffff94,
                                                   in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88);
    local_4 = local_20;
    if (!bVar2) {
      local_4 = -1;
    }
  }
  else if (DVar1 == CASEEXPR) {
    if (in_EDX == 0xffffffff) {
      local_4 = -1;
    }
    else {
      local_1c = in_EDX;
      bVar2 = Expr::ConstFold(in_RDI,(Env *)CONCAT44(in_stack_ffffffffffffff94,
                                                     in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88);
      if (bVar2) {
        if ((int)local_24 < (int)local_1c) {
          uVar3 = __cxa_allocate_exception(0x20);
          strfmt_abi_cxx11_(local_48,"current offset = %d, target offset = %d",(ulong)local_1c,
                            (ulong)local_24);
          ExceptionPaddingError::ExceptionPaddingError
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr);
          __cxa_throw(uVar3,&ExceptionPaddingError::typeinfo,
                      ExceptionPaddingError::~ExceptionPaddingError);
        }
        local_4 = local_24 - local_1c;
      }
      else {
        local_4 = -1;
      }
    }
  }
  else if (DVar1 == EXPR) {
    if ((in_EDX == 0xffffffff) || ((int)in_RDI[1].super_Object.filename._M_string_length == -1)) {
      local_4 = -1;
    }
    else {
      local_84 = (int)in_EDX % (int)in_RDI[1].super_Object.filename._M_string_length;
      if (local_84 == 0) {
        local_84 = 0;
      }
      else {
        local_84 = (int)in_RDI[1].super_Object.filename._M_string_length - local_84;
      }
      local_4 = local_84;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int RecordPaddingField::StaticSize(Env* env, int offset) const
	{
	int length;
	int target_offset;
	int offset_in_word;

	switch ( ptype_ )
		{
		case PAD_BY_LENGTH:
			return expr_->ConstFold(env, &length) ? length : -1;

		case PAD_TO_OFFSET:
			// If the current offset cannot be statically
			// determined, we need to Generate code to
			// check the offset
			if ( offset == -1 )
				return -1;

			if ( ! expr_->ConstFold(env, &target_offset) )
				return -1;

			// If both the current and target offsets
			// can be statically computed, we can get its
			// static size
			if ( offset > target_offset )
				throw ExceptionPaddingError(this, strfmt("current offset = %d, "
				                                         "target offset = %d",
				                                         offset, target_offset));
			return target_offset - offset;

		case PAD_TO_NEXT_WORD:
			if ( offset == -1 || wordsize_ == -1 )
				return -1;

			offset_in_word = offset % wordsize_;
			return (offset_in_word == 0) ? 0 : wordsize_ - offset_in_word;
		}

	return -1;
	}